

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseIfExpr(Parser *this)

{
  bool bVar1;
  pointer pBVar2;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_100;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  undefined1 local_98 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> elseBlock;
  string local_88 [32];
  undefined1 local_68 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> thenBlock;
  undefined1 local_50 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> condition;
  Token keyword;
  Parser *this_local;
  
  Token::Token((Token *)&condition,&in_RSI->m_previous);
  parseExpr((Parser *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected \'{\' or \'=>\' before if expression body.",
             (allocator<char> *)
             ((long)&elseBlock._M_t.
                     super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>
                     .super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl + 7));
  expectBlock((Parser *)local_68,(string *)in_RSI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&elseBlock._M_t.
                     super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>
                     .super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl + 7));
  local_b8._0_8_ = (__uniq_ptr_impl<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_a8._M_allocated_capacity = 0;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
            *)local_b8);
  std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_c0);
  std::
  make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>>>
            ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              *)local_98,
             (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_b8);
  std::unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>::~unique_ptr
            ((unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_c0);
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_b8);
  bVar1 = consume(in_RSI,ELSE);
  if (bVar1) {
    bVar1 = consume(in_RSI,IF);
    if (bVar1) {
      parseIfExpr((Parser *)local_c8);
      pBVar2 = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator->
                         ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)
                          local_98);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator=
                (&pBVar2->expr,
                 (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c8);
      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,"Expected \'{\' or \'=>\' after \'else\'.",&local_f1);
      expectBlock((Parser *)local_d0,(string *)in_RSI);
      std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator=
                ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_98,
                 (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_d0);
      std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
                ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
  }
  std::
  make_unique<enact::IfExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,enact::Token>
            (&local_100,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_50,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_68,
             (Token *)local_98);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::IfExpr,std::default_delete<enact::IfExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
             (unique_ptr<enact::IfExpr,_std::default_delete<enact::IfExpr>_> *)&local_100);
  std::unique_ptr<enact::IfExpr,_std::default_delete<enact::IfExpr>_>::~unique_ptr
            ((unique_ptr<enact::IfExpr,_std::default_delete<enact::IfExpr>_> *)&local_100);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
            ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_98);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
            ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_68);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_50);
  Token::~Token((Token *)&condition);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseIfExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> thenBlock = expectBlock("Expected '{' or '=>' before if expression body.");

        std::unique_ptr<BlockExpr> elseBlock = std::make_unique<BlockExpr>(
                std::vector<std::unique_ptr<Stmt>>{},
                std::make_unique<UnitExpr>(m_previous));

        if (consume(TokenType::ELSE)) {
            // Special case, so we can type 'else if' instead of 'else => if'
            if (consume(TokenType::IF)) {
                elseBlock->expr = parseIfExpr();
            } else {
                elseBlock = expectBlock("Expected '{' or '=>' after 'else'.");
            }
        }

        return std::make_unique<IfExpr>(
                std::move(condition),
                std::move(thenBlock),
                std::move(elseBlock),
                std::move(keyword));
    }